

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

void __thiscall
btQuantizedBvh::walkRecursiveQuantizedTreeAgainstQueryAabb
          (btQuantizedBvh *this,btQuantizedBvhNode *currentNode,btNodeOverlapCallback *nodeCallback,
          unsigned_short *quantizedQueryAabbMin,unsigned_short *quantizedQueryAabbMax)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  btQuantizedBvhNode *this_00;
  btNodeOverlapCallback *in_RCX;
  btQuantizedBvhNode *in_RDX;
  btQuantizedBvh *in_RSI;
  unsigned_short *in_R8;
  btQuantizedBvhNode *rightChildNode;
  btQuantizedBvhNode *leftChildNode;
  uint aabbOverlap;
  bool isLeafNode;
  unsigned_short *in_stack_ffffffffffffff98;
  unsigned_short *in_stack_ffffffffffffffa0;
  unsigned_short *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar5;
  
  uVar2 = testQuantizedAabbAgainstQuantizedAabb
                    ((unsigned_short *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                     ,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98)
  ;
  bVar1 = btQuantizedBvhNode::isLeafNode((btQuantizedBvhNode *)in_RSI);
  uVar5 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffd4);
  if (uVar2 != 0) {
    if (bVar1) {
      iVar3 = btQuantizedBvhNode::getPartId((btQuantizedBvhNode *)in_RSI);
      iVar4 = btQuantizedBvhNode::getTriangleIndex((btQuantizedBvhNode *)in_RSI);
      (**(code **)(*(long *)in_RDX + 0x10))(in_RDX,iVar3,iVar4);
    }
    else {
      this_00 = (btQuantizedBvhNode *)((in_RSI->m_bvhAabbMin).m_floats + 2);
      walkRecursiveQuantizedTreeAgainstQueryAabb
                (in_RSI,in_RDX,in_RCX,in_R8,(unsigned_short *)CONCAT44(uVar5,uVar2));
      bVar1 = btQuantizedBvhNode::isLeafNode(this_00);
      if (!bVar1) {
        btQuantizedBvhNode::getEscapeIndex(this_00);
      }
      walkRecursiveQuantizedTreeAgainstQueryAabb
                (in_RSI,in_RDX,in_RCX,in_R8,(unsigned_short *)CONCAT44(uVar5,uVar2));
    }
  }
  return;
}

Assistant:

void btQuantizedBvh::walkRecursiveQuantizedTreeAgainstQueryAabb(const btQuantizedBvhNode* currentNode,btNodeOverlapCallback* nodeCallback,unsigned short int* quantizedQueryAabbMin,unsigned short int* quantizedQueryAabbMax) const
{
	btAssert(m_useQuantization);
	
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap;

	//PCK: unsigned instead of bool
	aabbOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin,quantizedQueryAabbMax,currentNode->m_quantizedAabbMin,currentNode->m_quantizedAabbMax);
	isLeafNode = currentNode->isLeafNode();
		
	//PCK: unsigned instead of bool
	if (aabbOverlap != 0)
	{
		if (isLeafNode)
		{
			nodeCallback->processNode(currentNode->getPartId(),currentNode->getTriangleIndex());
		} else
		{
			//process left and right children
			const btQuantizedBvhNode* leftChildNode = currentNode+1;
			walkRecursiveQuantizedTreeAgainstQueryAabb(leftChildNode,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);

			const btQuantizedBvhNode* rightChildNode = leftChildNode->isLeafNode() ? leftChildNode+1:leftChildNode+leftChildNode->getEscapeIndex();
			walkRecursiveQuantizedTreeAgainstQueryAabb(rightChildNode,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);
		}
	}		
}